

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawExplicitDecal
          (PixelGameEngine *this,Decal *decal,vf2d *pos,vf2d *uv,Pixel *col,uint32_t elements)

{
  reference pvVar1;
  ulong uVar2;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar3;
  reference pvVar4;
  reference pvVar5;
  float fVar6;
  float fVar7;
  value_type local_c0;
  uint local_b8;
  uint32_t i;
  undefined1 local_a8 [8];
  DecalInstance di;
  uint32_t elements_local;
  Pixel *col_local;
  vf2d *uv_local;
  vf2d *pos_local;
  Decal *decal_local;
  PixelGameEngine *this_local;
  
  di.points = elements;
  DecalInstance::DecalInstance((DecalInstance *)local_a8);
  local_a8 = (undefined1  [8])decal;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)&di,
             (ulong)di.points);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             &di.pos.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)di.points);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &di.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)di.points);
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::resize
            ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
             &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(ulong)di.points);
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = di.points;
  for (local_b8 = 0; local_b8 < di.points; local_b8 = local_b8 + 1) {
    fVar6 = pos[local_b8].x * (this->vInvScreenSize).x;
    fVar7 = pos[local_b8].y * (this->vInvScreenSize).y;
    v2d_generic<float>::v2d_generic(&local_c0,fVar6 + fVar6 + -1.0,-(fVar7 + fVar7 + -1.0));
    pvVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(ulong)local_b8);
    *pvVar1 = local_c0;
    uVar2 = (ulong)local_b8;
    pvVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di.pos.
                            super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_b8);
    *pvVar1 = uv[uVar2];
    uVar2 = (ulong)local_b8;
    paVar3 = &std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator[]
                        ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
                         &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ulong)local_b8)->field_0;
    *paVar3 = col[uVar2].field_0;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &di.uv.
                         super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_b8);
    *pvVar4 = 1.0;
  }
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = this->nDecalMode;
  pvVar5 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,(ulong)this->nTargetLayer);
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&pvVar5->vecDecalInstance,(value_type *)local_a8);
  DecalInstance::~DecalInstance((DecalInstance *)local_a8);
  return;
}

Assistant:

void PixelGameEngine::DrawExplicitDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::vf2d *uv, const olc::Pixel *col, uint32_t elements)
	{
		DecalInstance di;
		di.decal = decal;
		di.pos.resize(elements);
		di.uv.resize(elements);
		di.w.resize(elements);
		di.tint.resize(elements);
		di.points = elements;
		for (uint32_t i = 0; i < elements; i++)
		{
			di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			di.uv[i] = uv[i];
			di.tint[i] = col[i];
			di.w[i] = 1.0f;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}